

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

char_t * pugi::impl::anon_unknown_0::
         strconv_pcdata_impl<pugi::impl::(anonymous_namespace)::opt_false,_pugi::impl::(anonymous_namespace)::opt_true,_pugi::impl::(anonymous_namespace)::opt_false>
         ::parse(char_t *s)

{
  size_t sVar1;
  byte *pbVar2;
  byte bVar3;
  char_t *pcVar4;
  byte *s_00;
  gap g;
  gap local_28;
  
  local_28.end = (char_t *)0x0;
  local_28.size = 0;
  do {
    sVar1 = local_28.size;
    bVar3 = *s;
    s_00 = (byte *)s;
    if (((anonymous_namespace)::chartype_table[bVar3] & 1) == 0) {
      pbVar2 = (byte *)s + 2;
      do {
        s_00 = pbVar2;
        bVar3 = s_00[-1];
        if (((anonymous_namespace)::chartype_table[bVar3] & 1) != 0) {
          s_00 = s_00 + -1;
          goto LAB_00107986;
        }
        bVar3 = *s_00;
        if (((anonymous_namespace)::chartype_table[bVar3] & 1) != 0) goto LAB_00107986;
        bVar3 = s_00[1];
        if (((anonymous_namespace)::chartype_table[bVar3] & 1) != 0) {
          s_00 = s_00 + 1;
          goto LAB_00107986;
        }
        bVar3 = s_00[2];
        pbVar2 = s_00 + 4;
      } while (((anonymous_namespace)::chartype_table[bVar3] & 1) == 0);
      s_00 = s_00 + 2;
    }
LAB_00107986:
    if (bVar3 == 0xd) {
      s = (char_t *)(s_00 + 1);
      *s_00 = 10;
      if (s_00[1] == 10) {
        if ((byte *)local_28.end != (byte *)0x0) {
          if (s < local_28.end) {
            __assert_fail("s >= end",
                          "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/libs/pugixml/src/pugixml.cpp"
                          ,0x974,
                          "void pugi::impl::(anonymous namespace)::gap::push(char_t *&, size_t)");
          }
          memmove(local_28.end + -local_28.size,local_28.end,(long)s - (long)local_28.end);
        }
        s = (char_t *)(s_00 + 2);
        local_28.size = sVar1 + 1;
        local_28.end = s;
      }
    }
    else {
      if (bVar3 == 0) {
        pcVar4 = gap::flush(&local_28,(char_t *)s_00);
        *pcVar4 = '\0';
        return (char_t *)s_00;
      }
      if (bVar3 == 0x3c) {
        pcVar4 = gap::flush(&local_28,(char_t *)s_00);
        *pcVar4 = '\0';
        return (char_t *)(s_00 + 1);
      }
      s = (char_t *)(s_00 + 1);
    }
  } while( true );
}

Assistant:

static char_t* parse(char_t* s)
		{
			gap g;

			char_t* begin = s;

			while (true)
			{
				PUGI__SCANWHILE_UNROLL(!PUGI__IS_CHARTYPE(ss, ct_parse_pcdata));

				if (*s == '<') // PCDATA ends here
				{
					char_t* end = g.flush(s);

					if (opt_trim::value)
						while (end > begin && PUGI__IS_CHARTYPE(end[-1], ct_space))
							--end;

					*end = 0;

					return s + 1;
				}
				else if (opt_eol::value && *s == '\r') // Either a single 0x0d or 0x0d 0x0a pair
				{
					*s++ = '\n'; // replace first one with 0x0a

					if (*s == '\n') g.push(s, 1);
				}
				else if (opt_escape::value && *s == '&')
				{
					s = strconv_escape(s, g);
				}
				else if (*s == 0)
				{
					char_t* end = g.flush(s);

					if (opt_trim::value)
						while (end > begin && PUGI__IS_CHARTYPE(end[-1], ct_space))
							--end;

					*end = 0;

					return s;
				}
				else ++s;
			}
		}